

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  WrapMode2D wrapMode;
  WrapMode2D wrapMode_00;
  Point2i p;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<int> out;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  undefined1 uVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  WrapMode WVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  reference pvVar15;
  Point2i PVar16;
  undefined8 uVar17;
  uint *puVar18;
  FILE *pFVar19;
  long in_RSI;
  int in_EDI;
  Float FVar20;
  Float FVar21;
  char **in_stack_00000058;
  int in_stack_00000060;
  char **in_stack_000000d8;
  int in_stack_000000e0;
  char **in_stack_00000118;
  int in_stack_00000120;
  ColorEncodingHandle *in_stack_00000158;
  string *in_stack_00000160;
  Allocator in_stack_00000168;
  int c_1;
  int i_1;
  Float noise;
  int dy;
  int dx;
  int c;
  int i;
  FILE *f;
  RNG rng;
  int vb;
  int va;
  int nPixels;
  Image image;
  ImageChannelDesc rgbDesc;
  ImageAndMetadata imRead;
  anon_class_1_0_00000001 onError;
  int nInstances;
  Float sigma;
  int width;
  array<int,_2UL> pixel;
  string filename;
  char **in_stack_00000898;
  int in_stack_000008a0;
  char **in_stack_00000998;
  int in_stack_000009a0;
  char **in_stack_00001058;
  int in_stack_00001060;
  string *in_stack_fffffffffffff6b8;
  undefined4 uVar22;
  ImageAndMetadata *in_stack_fffffffffffff6c0;
  undefined4 uVar23;
  undefined4 in_stack_fffffffffffff6c8;
  WrapMode in_stack_fffffffffffff6cc;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_fffffffffffff6d0;
  undefined4 in_stack_fffffffffffff6e0;
  undefined4 in_stack_fffffffffffff6e4;
  char *in_stack_fffffffffffff6e8;
  FILE *pFVar24;
  allocator<char> *in_stack_fffffffffffff6f0;
  undefined4 in_stack_fffffffffffff6f8;
  undefined4 in_stack_fffffffffffff6fc;
  PBRTOptions *in_stack_fffffffffffff700;
  undefined4 in_stack_fffffffffffff708;
  undefined4 in_stack_fffffffffffff70c;
  undefined4 in_stack_fffffffffffff710;
  int in_stack_fffffffffffff714;
  char *in_stack_fffffffffffff718;
  LogLevel in_stack_fffffffffffff724;
  char **in_stack_fffffffffffff728;
  int in_stack_fffffffffffff730;
  undefined3 uVar25;
  LogLevel in_stack_fffffffffffff734;
  Float in_stack_fffffffffffff738;
  float in_stack_fffffffffffff73c;
  undefined4 in_stack_fffffffffffff740;
  undefined4 in_stack_fffffffffffff744;
  WrapMode WVar26;
  int in_stack_fffffffffffff74c;
  int in_stack_fffffffffffff750;
  undefined4 in_stack_fffffffffffff754;
  int *in_stack_fffffffffffff758;
  Image *in_stack_fffffffffffff798;
  undefined4 in_stack_fffffffffffff7a0;
  undefined4 in_stack_fffffffffffff7a4;
  size_t in_stack_fffffffffffff7a8;
  ImageChannelDesc *in_stack_fffffffffffff7b8;
  Image *in_stack_fffffffffffff7c0;
  Allocator in_stack_fffffffffffff7c8;
  string *local_808;
  bool local_771;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *onError_00;
  undefined7 in_stack_fffffffffffff898;
  string *name;
  int local_72c;
  undefined4 in_stack_fffffffffffff8d8;
  undefined4 in_stack_fffffffffffff8dc;
  string *in_stack_fffffffffffff8e0;
  undefined4 in_stack_fffffffffffff8e8;
  undefined4 in_stack_fffffffffffff8ec;
  undefined4 in_stack_fffffffffffff8f0;
  undefined4 in_stack_fffffffffffff8f4;
  undefined4 in_stack_fffffffffffff8f8;
  int iVar27;
  undefined4 in_stack_fffffffffffff8fc;
  RNG local_6f8;
  WrapMode local_6e8;
  int local_6e4;
  WrapMode local_6e0;
  int local_6dc;
  char **in_stack_fffffffffffff928;
  int local_6d0;
  int iStack_6c4;
  int local_6c0;
  Image local_6b0;
  undefined1 local_594;
  allocator<char> local_593;
  allocator<char> local_592;
  allocator<char> local_591;
  string *local_590;
  string local_588 [32];
  undefined1 local_568 [32];
  undefined1 local_548 [32];
  string *local_528;
  undefined8 local_520;
  char **in_stack_fffffffffffffb98;
  int in_stack_fffffffffffffba0;
  char **in_stack_fffffffffffffc88;
  int in_stack_fffffffffffffc90;
  char **in_stack_fffffffffffffcc8;
  int in_stack_fffffffffffffcd0;
  string local_2b0 [39];
  byte local_289;
  char **in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd84;
  allocator<char> local_261;
  string local_260 [39];
  byte local_239;
  byte local_213;
  byte local_212;
  allocator<char> local_211;
  string local_210 [39];
  byte local_1e9;
  char **in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe34;
  allocator<char> local_1c1;
  string local_1c0 [32];
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_1a0;
  span<int> local_180;
  undefined1 local_169 [37];
  int local_144;
  undefined4 local_140;
  uint local_13c;
  undefined1 local_138 [8];
  string local_130 [48];
  undefined4 local_100;
  undefined4 local_fc;
  undefined1 local_f8;
  undefined1 local_f7;
  undefined1 local_f6;
  undefined1 local_f5;
  undefined1 local_f4;
  undefined1 local_f3;
  undefined1 local_f2;
  undefined1 local_f1;
  undefined4 local_f0;
  undefined4 local_ec;
  optional<int> local_e8;
  optional<int> local_e0;
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  aligned_storage_t<sizeof(pbrt::Bounds2<float>),_alignof(pbrt::Bounds2<float>)> local_38;
  undefined4 local_28;
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> local_24;
  undefined4 local_14;
  long *local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_100 = 0;
  local_fc = 0;
  local_f8 = 0;
  local_f7 = 0;
  local_f6 = 0;
  local_f5 = 0;
  local_f4 = 0;
  local_f3 = 0;
  local_f2 = 0;
  local_f1 = 0;
  local_f0 = 1;
  local_ec = 1;
  local_e8.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
  local_e8.set = false;
  local_e8._5_3_ = 0;
  local_10 = (long *)in_RSI;
  local_8 = in_EDI;
  pstd::optional<int>::optional(&local_e8);
  local_e0.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
  local_e0.set = false;
  local_e0._5_3_ = 0;
  pstd::optional<int>::optional(&local_e0);
  std::__cxx11::string::string(local_d8);
  std::__cxx11::string::string(local_b8);
  std::__cxx11::string::string(local_98);
  std::__cxx11::string::string(local_78);
  std::__cxx11::string::string(local_58);
  local_38 = (aligned_storage_t<sizeof(pbrt::Bounds2<float>),_alignof(pbrt::Bounds2<float>)>)0x0;
  local_28 = 0;
  pstd::optional<pbrt::Bounds2<float>_>::optional
            ((optional<pbrt::Bounds2<float>_> *)&local_38.__align);
  local_24._0_8_ = 0;
  local_24._8_8_ = 0;
  local_14 = 0;
  pstd::optional<pbrt::Bounds2<int>_>::optional((optional<pbrt::Bounds2<int>_> *)&local_24.__align);
  pbrt::InitPBRT(in_stack_fffffffffffff700);
  pbrt::PBRTOptions::~PBRTOptions((PBRTOptions *)in_stack_fffffffffffff6c0);
  if (local_8 < 2) {
    help();
    local_4 = 0;
  }
  else {
    iVar9 = strcmp(*(char **)((long)local_10 + 8),"average");
    if (iVar9 == 0) {
      local_4 = average(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    }
    else {
      iVar9 = strcmp(*(char **)((long)local_10 + 8),"assemble");
      if (iVar9 == 0) {
        local_4 = assemble(va,(char **)rng.inc);
      }
      else {
        iVar9 = strcmp(*(char **)((long)local_10 + 8),"bloom");
        if (iVar9 == 0) {
          local_4 = bloom(in_stack_00000120,in_stack_00000118);
        }
        else {
          iVar9 = strcmp(*(char **)((long)local_10 + 8),"cat");
          if (iVar9 == 0) {
            local_4 = cat(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
          }
          else {
            iVar9 = strcmp(*(char **)((long)local_10 + 8),"convert");
            if (iVar9 == 0) {
              local_4 = convert(in_stack_00001060,in_stack_00001058);
            }
            else {
              iVar9 = strcmp(*(char **)((long)local_10 + 8),"diff");
              if (iVar9 == 0) {
                local_4 = diff(in_stack_000008a0,in_stack_00000898);
              }
              else {
                iVar9 = strcmp(*(char **)((long)local_10 + 8),"denoise");
                if (iVar9 == 0) {
                  local_4 = denoise(in_stack_000009a0,in_stack_00000998);
                }
                else {
                  iVar9 = strcmp(*(char **)((long)local_10 + 8),"error");
                  if (iVar9 == 0) {
                    local_4 = error((int)image.p32.nAlloc,(char **)image.p32.ptr);
                  }
                  else {
                    iVar9 = strcmp(*(char **)((long)local_10 + 8),"falsecolor");
                    if (iVar9 == 0) {
                      local_4 = falsecolor(in_stack_00000060,in_stack_00000058);
                    }
                    else {
                      iVar9 = strcmp(*(char **)((long)local_10 + 8),"help");
                      if ((((iVar9 == 0) ||
                           (iVar9 = strcmp(*(char **)((long)local_10 + 8),"-help"), iVar9 == 0)) ||
                          (iVar9 = strcmp(*(char **)((long)local_10 + 8),"--help"), iVar9 == 0)) ||
                         (iVar9 = strcmp(*(char **)((long)local_10 + 8),"-h"), iVar9 == 0)) {
                        local_4 = help(in_stack_fffffffffffff730,in_stack_fffffffffffff728);
                      }
                      else {
                        iVar9 = strcmp(*(char **)((long)local_10 + 8),"info");
                        if (iVar9 == 0) {
                          uVar14 = (ulong)_local_6d0 >> 0x20;
                          local_4 = info((int)uVar14,in_stack_fffffffffffff928);
                        }
                        else {
                          iVar9 = strcmp(*(char **)((long)local_10 + 8),"makeenv");
                          if (iVar9 == 0) {
                            local_4 = makeenv(in_stack_fffffffffffffe34,in_stack_fffffffffffffe28);
                          }
                          else {
                            iVar9 = strcmp(*(char **)((long)local_10 + 8),"makeemitters");
                            if (iVar9 == 0) {
                              local_4 = makeemitters(in_stack_fffffffffffffcd0,
                                                     in_stack_fffffffffffffcc8);
                            }
                            else {
                              iVar9 = strcmp(*(char **)((long)local_10 + 8),"makesky");
                              if (iVar9 == 0) {
                                local_4 = makesky(in_stack_fffffffffffffd84,
                                                  in_stack_fffffffffffffd78);
                              }
                              else {
                                iVar9 = strcmp(*(char **)((long)local_10 + 8),"whitebalance");
                                if (iVar9 == 0) {
                                  local_4 = whitebalance(in_stack_000000e0,in_stack_000000d8);
                                }
                                else {
                                  iVar9 = strcmp(*(char **)((long)local_10 + 8),"noisybit");
                                  if (iVar9 == 0) {
                                    local_10 = (long *)((long)local_10 + 0x10);
                                    std::__cxx11::string::string(local_130);
                                    memset(local_138,0,8);
                                    local_13c = 10;
                                    local_140 = 0x3f800000;
                                    local_144 = 100;
                                    while (*local_10 != 0) {
                                      name = (string *)local_169;
                                      std::allocator<char>::allocator();
                                      bVar4 = false;
                                      bVar3 = false;
                                      local_1e9 = 0;
                                      local_212 = 0;
                                      local_213 = 0;
                                      local_239 = 0;
                                      bVar2 = false;
                                      bVar8 = false;
                                      local_289 = 0;
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffff700,
                                                 (char *)CONCAT44(in_stack_fffffffffffff6fc,
                                                                  in_stack_fffffffffffff6f8),
                                                 in_stack_fffffffffffff6f0);
                                      local_180 = pstd::MakeSpan<std::array<int,_2UL>_>
                                                            ((array<int,_2UL> *)
                                                             in_stack_fffffffffffff6c0);
                                      onError_00 = &local_1a0;
                                      std::function<void(std::__cxx11::string)>::
                                      function<main::__0&,void>
                                                (in_stack_fffffffffffff6d0,
                                                 (anon_class_1_0_00000001 *)
                                                 CONCAT44(in_stack_fffffffffffff6cc,
                                                          in_stack_fffffffffffff6c8));
                                      out.ptr._4_4_ = in_stack_fffffffffffff8f4;
                                      out.ptr._0_4_ = in_stack_fffffffffffff8f0;
                                      out.n._0_4_ = in_stack_fffffffffffff8f8;
                                      out.n._4_4_ = in_stack_fffffffffffff8fc;
                                      uVar6 = pbrt::ParseArg<pstd::span<int>>
                                                        ((char ***)
                                                         CONCAT44(in_stack_fffffffffffff8ec,
                                                                  in_stack_fffffffffffff8e8),
                                                         in_stack_fffffffffffff8e0,out,
                                                         (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)CONCAT44(in_stack_fffffffffffff8dc,
                                                             in_stack_fffffffffffff8d8));
                                      local_771 = true;
                                      if (!(bool)uVar6) {
                                        std::allocator<char>::allocator();
                                        bVar4 = true;
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffff700,
                                                  (char *)CONCAT44(in_stack_fffffffffffff6fc,
                                                                   in_stack_fffffffffffff6f8),
                                                  in_stack_fffffffffffff6f0);
                                        bVar3 = true;
                                        std::function<void(std::__cxx11::string)>::
                                        function<main::__0&,void>
                                                  (in_stack_fffffffffffff6d0,
                                                   (anon_class_1_0_00000001 *)
                                                   CONCAT44(in_stack_fffffffffffff6cc,
                                                            in_stack_fffffffffffff6c8));
                                        local_1e9 = 1;
                                        bVar7 = pbrt::ParseArg<int*>
                                                          ((char ***)0x0,name,
                                                           (int *)CONCAT17(uVar6,
                                                  in_stack_fffffffffffff898),onError_00);
                                        local_771 = true;
                                        if (!bVar7) {
                                          std::allocator<char>::allocator();
                                          local_212 = 1;
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffff700,
                                                  (char *)CONCAT44(in_stack_fffffffffffff6fc,
                                                                   in_stack_fffffffffffff6f8),
                                                  in_stack_fffffffffffff6f0);
                                          local_213 = 1;
                                          std::function<void(std::__cxx11::string)>::
                                          function<main::__0&,void>
                                                    (in_stack_fffffffffffff6d0,
                                                     (anon_class_1_0_00000001 *)
                                                     CONCAT44(in_stack_fffffffffffff6cc,
                                                              in_stack_fffffffffffff6c8));
                                          local_239 = 1;
                                          bVar7 = pbrt::ParseArg<float*>
                                                            ((char ***)0x0,name,
                                                             (float *)CONCAT17(uVar6,
                                                  in_stack_fffffffffffff898),onError_00);
                                          local_771 = true;
                                          if (!bVar7) {
                                            std::allocator<char>::allocator();
                                            bVar2 = true;
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffff700,
                                                  (char *)CONCAT44(in_stack_fffffffffffff6fc,
                                                                   in_stack_fffffffffffff6f8),
                                                  in_stack_fffffffffffff6f0);
                                            bVar8 = true;
                                            std::function<void(std::__cxx11::string)>::
                                            function<main::__0&,void>
                                                      (in_stack_fffffffffffff6d0,
                                                       (anon_class_1_0_00000001 *)
                                                       CONCAT44(in_stack_fffffffffffff6cc,
                                                                in_stack_fffffffffffff6c8));
                                            local_289 = 1;
                                            local_771 = pbrt::ParseArg<int*>
                                                                  ((char ***)0x0,name,
                                                                   (int *)CONCAT17(uVar6,
                                                  in_stack_fffffffffffff898),onError_00);
                                          }
                                        }
                                      }
                                      if ((local_289 & 1) != 0) {
                                        std::
                                        function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                        ::~function((
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)0x3e8c10);
                                      }
                                      if (bVar8) {
                                        std::__cxx11::string::~string(local_260);
                                      }
                                      if (bVar2) {
                                        std::allocator<char>::~allocator(&local_261);
                                      }
                                      if ((local_239 & 1) != 0) {
                                        std::
                                        function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                        ::~function((
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)0x3e8c5b);
                                      }
                                      if ((local_213 & 1) != 0) {
                                        std::__cxx11::string::~string(local_210);
                                      }
                                      if ((local_212 & 1) != 0) {
                                        std::allocator<char>::~allocator(&local_211);
                                      }
                                      if ((local_1e9 & 1) != 0) {
                                        std::
                                        function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                        ::~function((
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)0x3e8ca6);
                                      }
                                      if (bVar3) {
                                        std::__cxx11::string::~string(local_1c0);
                                      }
                                      if (bVar4) {
                                        std::allocator<char>::~allocator(&local_1c1);
                                      }
                                      std::
                                      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                      ::~function((
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)0x3e8ce5);
                                      std::__cxx11::string::~string((string *)(local_169 + 1));
                                      std::allocator<char>::~allocator((allocator<char> *)local_169)
                                      ;
                                      if (local_771 == false) {
                                        uVar14 = std::__cxx11::string::empty();
                                        if ((uVar14 & 1) == 0) {
                                          pbrt::StringPrintf<char*&>
                                                    (in_stack_fffffffffffff6e8,
                                                     (char **)CONCAT44(in_stack_fffffffffffff6e4,
                                                                       in_stack_fffffffffffff6e0));
                                          main::anon_class_1_0_00000001::operator()
                                                    ((anon_class_1_0_00000001 *)
                                                     in_stack_fffffffffffff6c0,
                                                     in_stack_fffffffffffff6b8);
                                          std::__cxx11::string::~string(local_2b0);
                                        }
                                        else {
                                          std::__cxx11::string::operator=
                                                    (local_130,(char *)*local_10);
                                          local_10 = local_10 + 1;
                                        }
                                      }
                                    }
                                    uVar14 = std::__cxx11::string::empty();
                                    if ((uVar14 & 1) != 0) {
                                      pbrt::LogFatal<char_const(&)[18]>
                                                (in_stack_fffffffffffff724,in_stack_fffffffffffff718
                                                 ,in_stack_fffffffffffff714,
                                                 (char *)CONCAT44(in_stack_fffffffffffff70c,
                                                                  in_stack_fffffffffffff708),
                                                 (char (*) [18])in_stack_fffffffffffff700);
                                    }
                                    pstd::pmr::polymorphic_allocator<std::byte>::
                                    polymorphic_allocator
                                              ((polymorphic_allocator<std::byte> *)
                                               in_stack_fffffffffffff6c0);
                                    pbrt::ColorEncodingHandle::TaggedPointer
                                              ((ColorEncodingHandle *)in_stack_fffffffffffff6c0,
                                               in_stack_fffffffffffff6b8);
                                    pbrt::Image::Read(in_stack_00000160,in_stack_00000168,
                                                      in_stack_00000158);
                                    local_594 = 1;
                                    local_590 = local_588;
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)in_stack_fffffffffffff700,
                                               (char *)CONCAT44(in_stack_fffffffffffff6fc,
                                                                in_stack_fffffffffffff6f8),
                                               in_stack_fffffffffffff6f0);
                                    local_590 = (string *)local_568;
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)in_stack_fffffffffffff700,
                                               (char *)CONCAT44(in_stack_fffffffffffff6fc,
                                                                in_stack_fffffffffffff6f8),
                                               in_stack_fffffffffffff6f0);
                                    local_590 = (string *)local_548;
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)in_stack_fffffffffffff700,
                                               (char *)CONCAT44(in_stack_fffffffffffff6fc,
                                                                in_stack_fffffffffffff6f8),
                                               in_stack_fffffffffffff6f0);
                                    local_594 = 0;
                                    local_528 = local_588;
                                    local_520 = 3;
                                    v._M_array._4_4_ = in_stack_fffffffffffff6cc;
                                    v._M_array._0_4_ = in_stack_fffffffffffff6c8;
                                    v._M_len = (size_type)in_stack_fffffffffffff6d0;
                                    pstd::
                                    span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)in_stack_fffffffffffff6c0,v);
                                    requestedChannels.ptr._4_4_ = in_stack_fffffffffffff7a4;
                                    requestedChannels.ptr._0_4_ = in_stack_fffffffffffff7a0;
                                    requestedChannels.n = in_stack_fffffffffffff7a8;
                                    pbrt::Image::GetChannelDesc
                                              (in_stack_fffffffffffff798,requestedChannels);
                                    local_808 = (string *)&local_528;
                                    do {
                                      local_808 = local_808 + -0x20;
                                      std::__cxx11::string::~string(local_808);
                                    } while (local_808 != local_588);
                                    std::allocator<char>::~allocator(&local_593);
                                    std::allocator<char>::~allocator(&local_592);
                                    std::allocator<char>::~allocator(&local_591);
                                    bVar8 = pbrt::ImageChannelDesc::operator_cast_to_bool
                                                      ((ImageChannelDesc *)0x3e9223);
                                    if (!bVar8) {
                                      pbrt::LogFatal<char_const(&)[14]>
                                                (in_stack_fffffffffffff724,in_stack_fffffffffffff718
                                                 ,in_stack_fffffffffffff714,
                                                 (char *)CONCAT44(in_stack_fffffffffffff70c,
                                                                  in_stack_fffffffffffff708),
                                                 (char (*) [14])in_stack_fffffffffffff700);
                                    }
                                    pstd::pmr::polymorphic_allocator<std::byte>::
                                    polymorphic_allocator
                                              ((polymorphic_allocator<std::byte> *)
                                               in_stack_fffffffffffff6c0);
                                    pbrt::Image::SelectChannels
                                              (in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
                                               in_stack_fffffffffffff7c8);
                                    pvVar15 = std::array<int,_2UL>::operator[]
                                                        ((array<int,_2UL> *)
                                                         in_stack_fffffffffffff6c0,
                                                         (size_type)in_stack_fffffffffffff6b8);
                                    bVar8 = true;
                                    if (-1 < (int)(*pvVar15 - local_13c)) {
                                      pvVar15 = std::array<int,_2UL>::operator[]
                                                          ((array<int,_2UL> *)
                                                           in_stack_fffffffffffff6c0,
                                                           (size_type)in_stack_fffffffffffff6b8);
                                      iVar9 = *pvVar15 + local_13c;
                                      PVar16 = pbrt::Image::Resolution(&local_6b0);
                                      local_6c0 = PVar16.super_Tuple2<pbrt::Point2,_int>.x;
                                      bVar8 = true;
                                      if (iVar9 < local_6c0) {
                                        pvVar15 = std::array<int,_2UL>::operator[]
                                                            ((array<int,_2UL> *)
                                                             in_stack_fffffffffffff6c0,
                                                             (size_type)in_stack_fffffffffffff6b8);
                                        bVar8 = true;
                                        if (-1 < (int)(*pvVar15 - local_13c)) {
                                          pvVar15 = std::array<int,_2UL>::operator[]
                                                              ((array<int,_2UL> *)
                                                               in_stack_fffffffffffff6c0,
                                                               (size_type)in_stack_fffffffffffff6b8)
                                          ;
                                          iVar9 = *pvVar15 + local_13c;
                                          PVar16 = pbrt::Image::Resolution(&local_6b0);
                                          iStack_6c4 = PVar16.super_Tuple2<pbrt::Point2,_int>.y;
                                          bVar8 = iStack_6c4 <= iVar9;
                                        }
                                      }
                                    }
                                    if (bVar8) {
                                      pFVar19 = _stderr;
                                      uVar17 = std::__cxx11::string::c_str();
                                      puVar18 = (uint *)std::array<int,_2UL>::operator[]
                                                                  ((array<int,_2UL> *)
                                                                   in_stack_fffffffffffff6c0,
                                                                   (size_type)
                                                                   in_stack_fffffffffffff6b8);
                                      uVar11 = *puVar18;
                                      puVar18 = (uint *)std::array<int,_2UL>::operator[]
                                                                  ((array<int,_2UL> *)
                                                                   in_stack_fffffffffffff6c0,
                                                                   (size_type)
                                                                   in_stack_fffffffffffff6b8);
                                      uVar5 = local_13c;
                                      uVar23 = (undefined4)
                                               ((ulong)in_stack_fffffffffffff6c0 >> 0x20);
                                      uVar22 = (undefined4)
                                               ((ulong)in_stack_fffffffffffff6b8 >> 0x20);
                                      uVar1 = *puVar18;
                                      PVar16 = pbrt::Image::Resolution(&local_6b0);
                                      local_6d0 = PVar16.super_Tuple2<pbrt::Point2,_int>.x;
                                      PVar16 = pbrt::Image::Resolution(&local_6b0);
                                      in_stack_fffffffffffff6c0 =
                                           (ImageAndMetadata *)
                                           CONCAT44(uVar23,PVar16.super_Tuple2<pbrt::Point2,_int>.y)
                                      ;
                                      fprintf(pFVar19,
                                              "%s: pixel (%d, %d) with width %d doesn\'t work with resolution (%d, %d).\n"
                                              ,uVar17,(ulong)uVar11,(ulong)uVar1,(ulong)uVar5,
                                              CONCAT44(uVar22,local_6d0));
                                      local_4 = 1;
                                      local_6dc = 1;
                                    }
                                    else {
                                      WVar10 = pbrt::Sqr<int>(local_13c * 2 + 1);
                                      local_6e4 = local_144 * 3;
                                      local_6e8 = WVar10;
                                      local_6e0 = WVar10;
                                      if (local_6e4 < (int)WVar10) {
                                        pbrt::
                                        LogFatal<char_const(&)[15],char_const(&)[8],char_const(&)[15],int&,char_const(&)[8],int&>
                                                  (in_stack_fffffffffffff734,
                                                   (char *)in_stack_fffffffffffff728,
                                                   in_stack_fffffffffffff724,
                                                   in_stack_fffffffffffff718,
                                                   (char (*) [15])
                                                   CONCAT44(in_stack_fffffffffffff714,
                                                            in_stack_fffffffffffff710),
                                                   (char (*) [8])
                                                   CONCAT44(in_stack_fffffffffffff70c,
                                                            in_stack_fffffffffffff708),
                                                   (char (*) [15])
                                                   CONCAT44(in_stack_fffffffffffff744,
                                                            in_stack_fffffffffffff740),
                                                   (int *)CONCAT44(in_stack_fffffffffffff74c,WVar10)
                                                   ,(char (*) [8])
                                                    CONCAT44(in_stack_fffffffffffff754,
                                                             in_stack_fffffffffffff750),
                                                   in_stack_fffffffffffff758);
                                      }
                                      pbrt::RNG::RNG(&local_6f8);
                                      pFVar19 = fopen("m.csv","w");
                                      WVar26 = (WrapMode)((ulong)pFVar19 >> 0x20);
                                      for (iVar9 = 0; iVar9 < local_144; iVar9 = iVar9 + 1) {
                                        for (iVar27 = 0; iVar27 < 3; iVar27 = iVar27 + 1) {
                                          for (iVar13 = -local_13c; iVar13 <= (int)local_13c;
                                              iVar13 = iVar13 + 1) {
                                            for (iVar12 = -local_13c; iVar12 <= (int)local_13c;
                                                iVar12 = iVar12 + 1) {
                                              in_stack_fffffffffffff73c =
                                                   pbrt::RNG::Uniform<float>
                                                             ((RNG *)in_stack_fffffffffffff6c0);
                                              in_stack_fffffffffffff738 =
                                                   pbrt::SampleNormal((Float)((ulong)
                                                  in_stack_fffffffffffff6c0 >> 0x20),
                                                  SUB84(in_stack_fffffffffffff6c0,0),
                                                  (Float)((ulong)in_stack_fffffffffffff6b8 >> 0x20))
                                              ;
                                              uVar25 = (undefined3)in_stack_fffffffffffff734;
                                              in_stack_fffffffffffff734 = CONCAT13(1,uVar25);
                                              if (iVar13 == -local_13c ||
                                                  SBORROW4(iVar13,-local_13c) !=
                                                  (int)(iVar13 + local_13c) < 0) {
                                                in_stack_fffffffffffff734 =
                                                     CONCAT13((int)-local_13c < iVar12,uVar25);
                                              }
                                              uVar11 = 0x20;
                                              if ((char)(in_stack_fffffffffffff734 >> 0x18) != '\0')
                                              {
                                                uVar11 = 0x2c;
                                              }
                                              pFVar24 = pFVar19;
                                              FVar21 = in_stack_fffffffffffff738;
                                              std::array<int,_2UL>::operator[]
                                                        ((array<int,_2UL> *)
                                                         in_stack_fffffffffffff6c0,
                                                         (size_type)in_stack_fffffffffffff6b8);
                                              std::array<int,_2UL>::operator[]
                                                        ((array<int,_2UL> *)
                                                         in_stack_fffffffffffff6c0,
                                                         (size_type)in_stack_fffffffffffff6b8);
                                              pbrt::Point2<int>::Point2
                                                        ((Point2<int> *)in_stack_fffffffffffff6c0,
                                                         (int)((ulong)in_stack_fffffffffffff6b8 >>
                                                              0x20),(int)in_stack_fffffffffffff6b8);
                                              pbrt::WrapMode2D::WrapMode2D
                                                        ((WrapMode2D *)in_stack_fffffffffffff6d0,
                                                         in_stack_fffffffffffff6cc);
                                              PVar16.super_Tuple2<pbrt::Point2,_int>.y =
                                                   in_stack_fffffffffffff750;
                                              PVar16.super_Tuple2<pbrt::Point2,_int>.x =
                                                   in_stack_fffffffffffff74c;
                                              wrapMode.wrap.values[1] = WVar10;
                                              wrapMode.wrap.values[0] = WVar26;
                                              FVar20 = pbrt::Image::GetChannel
                                                                 ((Image *)CONCAT44(
                                                  in_stack_fffffffffffff73c,
                                                  in_stack_fffffffffffff738),PVar16,
                                                  in_stack_fffffffffffff734,wrapMode);
                                              fprintf(pFVar24,"%c%f ",(double)(FVar20 + FVar21),
                                                      (ulong)uVar11);
                                            }
                                          }
                                          fprintf(pFVar19,"\n");
                                        }
                                      }
                                      fclose(pFVar19);
                                      pFVar19 = fopen("b.csv","w");
                                      for (iVar9 = 0; iVar9 < local_144; iVar9 = iVar9 + 1) {
                                        for (local_72c = 0; local_72c < 3; local_72c = local_72c + 1
                                            ) {
                                          pFVar24 = pFVar19;
                                          std::array<int,_2UL>::operator[]
                                                    ((array<int,_2UL> *)in_stack_fffffffffffff6c0,
                                                     (size_type)in_stack_fffffffffffff6b8);
                                          std::array<int,_2UL>::operator[]
                                                    ((array<int,_2UL> *)in_stack_fffffffffffff6c0,
                                                     (size_type)in_stack_fffffffffffff6b8);
                                          pbrt::Point2<int>::Point2
                                                    ((Point2<int> *)in_stack_fffffffffffff6c0,
                                                     (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20)
                                                     ,(int)in_stack_fffffffffffff6b8);
                                          pbrt::WrapMode2D::WrapMode2D
                                                    ((WrapMode2D *)in_stack_fffffffffffff6d0,
                                                     in_stack_fffffffffffff6cc);
                                          p.super_Tuple2<pbrt::Point2,_int>.y =
                                               in_stack_fffffffffffff750;
                                          p.super_Tuple2<pbrt::Point2,_int>.x =
                                               in_stack_fffffffffffff74c;
                                          wrapMode_00.wrap.values[1] = WVar10;
                                          wrapMode_00.wrap.values[0] = WVar26;
                                          FVar21 = pbrt::Image::GetChannel
                                                             ((Image *)CONCAT44(
                                                  in_stack_fffffffffffff73c,
                                                  in_stack_fffffffffffff738),p,
                                                  in_stack_fffffffffffff734,wrapMode_00);
                                          fprintf(pFVar24,"%f\n",(double)FVar21);
                                        }
                                      }
                                      fclose(pFVar19);
                                      local_6dc = 0;
                                    }
                                    pbrt::Image::~Image(&in_stack_fffffffffffff6c0->image);
                                    pbrt::ImageChannelDesc::~ImageChannelDesc
                                              ((ImageChannelDesc *)0x3e9b43);
                                    pbrt::ImageAndMetadata::~ImageAndMetadata
                                              (in_stack_fffffffffffff6c0);
                                    std::__cxx11::string::~string(local_130);
                                    if (local_6dc == 0) {
                                      pbrt::CleanupPBRT();
                                      local_4 = 0;
                                    }
                                  }
                                  else {
                                    fprintf(_stderr,"imgtool: unknown command \"%s\"",
                                            *(undefined8 *)((long)local_10 + 8));
                                    help();
                                    pbrt::CleanupPBRT();
                                    local_4 = 1;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int main(int argc, char *argv[]) {
    InitPBRT({});

    if (argc < 2) {
        help();
        return 0;
    }

    if (strcmp(argv[1], "average") == 0)
        return average(argc - 2, argv + 2);
    else if (strcmp(argv[1], "assemble") == 0)
        return assemble(argc - 2, argv + 2);
    else if (strcmp(argv[1], "bloom") == 0)
        return bloom(argc - 2, argv + 2);
    else if (strcmp(argv[1], "cat") == 0)
        return cat(argc - 2, argv + 2);
    else if (strcmp(argv[1], "convert") == 0)
        return convert(argc - 2, argv + 2);
    else if (strcmp(argv[1], "diff") == 0)
        return diff(argc - 2, argv + 2);
    else if (strcmp(argv[1], "denoise") == 0)
        return denoise(argc - 2, argv + 2);
#ifdef PBRT_BUILD_GPU_RENDERER
    else if (strcmp(argv[1], "denoise-optix") == 0)
        return denoise_optix(argc - 2, argv + 2);
#endif  // PBRT_BUILD_GPU_RENDERER
    else if (strcmp(argv[1], "error") == 0)
        return error(argc - 2, argv + 2);
    else if (strcmp(argv[1], "falsecolor") == 0)
        return falsecolor(argc - 2, argv + 2);
    else if (strcmp(argv[1], "help") == 0 || strcmp(argv[1], "-help") == 0 ||
             strcmp(argv[1], "--help") == 0 || strcmp(argv[1], "-h") == 0)
        return help(argc - 2, argv + 2);
    else if (strcmp(argv[1], "info") == 0)
        return info(argc - 2, argv + 2);
    else if (strcmp(argv[1], "makeenv") == 0)
        return makeenv(argc - 2, argv + 2);
    else if (strcmp(argv[1], "makeemitters") == 0)
        return makeemitters(argc - 2, argv + 2);
    else if (strcmp(argv[1], "makesky") == 0)
        return makesky(argc - 2, argv + 2);
    else if (strcmp(argv[1], "whitebalance") == 0)
        return whitebalance(argc - 2, argv + 2);
    else if (strcmp(argv[1], "noisybit") == 0) {
        // hack for brute force comptuation of ideal filter weights.

        argv += 2;
        std::string filename;
        std::array<int, 2> pixel = {0, 0};
        int width = 10;
        Float sigma = 1;
        int nInstances = 100;

        while (*argv != nullptr) {
            auto onError = [](const std::string &err) {
                usage("%s", err.c_str());
                exit(1);
            };
            if (ParseArg(&argv, "pixel", pstd::MakeSpan(pixel), onError) ||
                ParseArg(&argv, "width", &width, onError) ||
                ParseArg(&argv, "sigma", &sigma, onError) ||
                ParseArg(&argv, "n", &nInstances, onError))
                ;  // yaay
            else if (filename.empty()) {
                filename = *argv;
                ++argv;
            } else
                onError(StringPrintf("unexpected argument \"%s\"", *argv));
        }
        CHECK(!filename.empty());

        ImageAndMetadata imRead = Image::Read(filename);
        ImageChannelDesc rgbDesc = imRead.image.GetChannelDesc({"R", "G", "B"});
        CHECK((bool)rgbDesc);
        Image image = imRead.image.SelectChannels(rgbDesc);

        if (pixel[0] - width < 0 || pixel[0] + width >= image.Resolution().x ||
            pixel[0] - width < 0 || pixel[0] + width >= image.Resolution().y) {
            fprintf(stderr,
                    "%s: pixel (%d, %d) with width %d doesn't work with "
                    "resolution (%d, %d).\n",
                    filename.c_str(), pixel[0], pixel[0], width, image.Resolution().x,
                    image.Resolution().y);
            return 1;
        }

        int nPixels = Sqr(2 * width + 1);
        CHECK_GE(3 * nInstances, nPixels);  // want to be overconstrained

        RNG rng;
        //
        FILE *f = fopen("m.csv", "w");
        for (int i = 0; i < nInstances; ++i)
            for (int c = 0; c < 3; ++c) {
                for (int dx = -width; dx <= width; ++dx)
                    for (int dy = -width; dy <= width; ++dy) {
                        // Float noise = .1 * std::exp(-rng.Uniform<Float>() *
                        // 3); if (rng.Uniform<Float>() < .5) noise = -noise;
                        Float noise = SampleNormal(rng.Uniform<Float>(), 0., .1);
                        // TODO: use sigma, make this controllable, etc.
                        fprintf(f, "%c%f ", (dx > -width || dy > -width) ? ',' : ' ',
                                image.GetChannel({pixel[0] + dx, pixel[1] + dy}, c)
                                    // *  (.95 + .05 * rng.Uniform<Float>())
                                    + noise);
                    }
                fprintf(f, "\n");
            }
        fclose(f);

        // what it should equal
        f = fopen("b.csv", "w");
        for (int i = 0; i < nInstances; ++i)
            for (int c = 0; c < 3; ++c)
                fprintf(f, "%f\n", image.GetChannel({pixel[0], pixel[1]}, c));
        fclose(f);

        /*
          LeastSquares[Import["m.csv"], Import["b.csv"]]
          ArrayPlot[ArrayReshape[ %, {21, 21}], ColorFunction -> Function[a,
          GrayLevel[4 a]]]
        */
    } else {
        fprintf(stderr, "imgtool: unknown command \"%s\"", argv[1]);
        help();
        CleanupPBRT();
        return 1;
    }